

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMocker<solitaire::interfaces::Button_&()>::PerformDefaultAction
          (FunctionMocker<solitaire::interfaces::Button_&()> *this,ArgumentTuple *args,
          string *call_description)

{
  pointer pcVar1;
  Result pBVar2;
  OnCallSpec<solitaire::interfaces::Button_&()> *this_00;
  Action<solitaire::interfaces::Button_&()> *pAVar3;
  Result pBVar4;
  runtime_error *this_01;
  string message;
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<solitaire::interfaces::Button_&()> *)0x0) {
    pAVar3 = OnCallSpec<solitaire::interfaces::Button_&()>::GetAction(this_00);
    pBVar4 = Action<solitaire::interfaces::Button_&()>::Perform(pAVar3);
    return pBVar4;
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  pBVar2 = DefaultValue<solitaire::interfaces::Button&>::address_;
  if (DefaultValue<solitaire::interfaces::Button&>::address_ != (Result)0x0) {
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    return pBVar2;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }